

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::CaptureSourceAndGroups
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,Recycler *recycler,Program *program,
          EncodedChar *body,CharCount bodyChars,CharCount bodyEncodedChars)

{
  code *pcVar1;
  Program *this_00;
  bool bVar2;
  char16_t **ppcVar3;
  undefined4 *puVar4;
  Recycler *this_01;
  char16_t *ptr;
  TrackAllocData local_58;
  CharCount local_30;
  CharCount local_2c;
  CharCount bodyEncodedChars_local;
  CharCount bodyChars_local;
  EncodedChar *body_local;
  Program *program_local;
  Recycler *recycler_local;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_local;
  
  local_30 = bodyEncodedChars;
  local_2c = bodyChars;
  _bodyEncodedChars_local = body;
  body_local = (EncodedChar *)program;
  program_local = (Program *)recycler;
  recycler_local = (Recycler *)this;
  ppcVar3 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__((WriteBarrierPtr *)program);
  if (*ppcVar3 != (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbfa,"(program->source == 0)","program->source == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (_bodyEncodedChars_local == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbfb,"(body != 0)","body != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_00 = program_local;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&char16_t::typeinfo,0,(ulong)(local_2c + 1),
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
             ,0xbfe);
  this_01 = Memory::Recycler::TrackAllocInfo((Recycler *)this_00,&local_58);
  ptr = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                  ((Memory *)this_01,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)(local_2c + 1)
                  );
  Memory::WriteBarrierPtr<char16_t>::operator=((WriteBarrierPtr<char16_t> *)body_local,ptr);
  ppcVar3 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__((WriteBarrierPtr *)body_local);
  UTF8EncodingPolicyBase<false>::ConvertToUnicode
            (&this->super_UTF8EncodingPolicyBase<false>,*ppcVar3,local_2c,_bodyEncodedChars_local,
             _bodyEncodedChars_local + local_30);
  ppcVar3 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__((WriteBarrierPtr *)body_local);
  (*ppcVar3)[local_2c] = L'\0';
  *(CharCount *)(body_local + 8) = local_2c;
  if (this->nextGroupId < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc07,"(nextGroupId > 0)","nextGroupId > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (0x7fff < this->nextGroupId) {
    Js::JavascriptError::ThrowRangeError(this->scriptContext,-0x7ff5e9d5,(PCWSTR)0x0);
  }
  *(short *)(body_local + 0xc) = (short)this->nextGroupId;
  return;
}

Assistant:

void Parser<P, IsLiteral>::CaptureSourceAndGroups(Recycler* recycler, Program* program, const EncodedChar* body, CharCount bodyChars, CharCount bodyEncodedChars)
    {
        Assert(program->source == 0);
        Assert(body != 0);

        // Program will own source string
        program->source = RecyclerNewArrayLeaf(recycler, Char, bodyChars + 1);
        // Don't need to zero out since we're writing to the buffer right here
        this->ConvertToUnicode(program->source, bodyChars, body, body + bodyEncodedChars);

        program->source[bodyChars] = 0;
        program->sourceLen = bodyChars;

        // We expect nextGroupId to be positive, because the full regexp itself always
        // counts as a capturing group.
        Assert(nextGroupId > 0);
        if (nextGroupId > MAX_NUM_GROUPS)
        {
            Js::JavascriptError::ThrowRangeError(this->scriptContext, JSERR_RegExpTooManyCapturingGroups);
        }
        else
        {
            program->numGroups = static_cast<uint16>(nextGroupId);
        }

        // Remaining to set during compilation: litbuf, litbufLen, numLoops, insts, instsLen, entryPointLabel
    }